

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitops.h
# Opt level: O3

uint64_t helper_dvstep(uint64_t r1,uint32_t r2)

{
  uint uVar1;
  uint32_t uVar2;
  uint uVar3;
  ulong uVar4;
  int iVar5;
  uint uVar6;
  bool bVar7;
  
  uVar1 = -(int)((long)r1 >> 0x3f);
  uVar2 = -r2;
  if (r2 >> 0x1f != uVar1) {
    uVar2 = r2;
  }
  uVar4 = r1 >> 0x20;
  iVar5 = 8;
  do {
    uVar6 = (int)uVar4 << 1 | (uint)r1 >> 0x1f;
    uVar3 = uVar6 + uVar2;
    bVar7 = uVar3 >> 0x1f == uVar1;
    if (!bVar7) {
      uVar3 = uVar6;
    }
    uVar4 = (ulong)uVar3;
    uVar6 = (uint)(bVar7 != (r2 >> 0x1f != uVar1)) + (uint)r1 * 2;
    r1 = (uint64_t)uVar6;
    iVar5 = iVar5 + -1;
  } while (iVar5 != 0);
  return CONCAT44(uVar3,uVar6);
}

Assistant:

static inline uint64_t extract64(uint64_t value, int start, int length)
{
    assert(start >= 0 && length > 0 && length <= 64 - start);
    return (value >> start) & (~0ULL >> (64 - length));
}